

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

AggregateInitialiserList * __thiscall
soul::ModuleCloner::cloneInitialiserList(ModuleCloner *this,AggregateInitialiserList *old)

{
  uint64_t *puVar1;
  Expression *pEVar2;
  pool_ref<soul::heart::Expression> local_48;
  pool_ref<soul::heart::Expression> *local_40;
  pool_ref<soul::heart::Expression> *i;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *__range2;
  AggregateInitialiserList *l;
  AggregateInitialiserList *old_local;
  ModuleCloner *this_local;
  
  l = old;
  old_local = (AggregateInitialiserList *)this;
  __range2 = (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
             Module::
             allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation_const&,soul::Type_const&>
                       (this->newModule,&(old->super_Expression).super_Object.location,&old->type);
  __begin2 = (pool_ref<soul::heart::Expression> *)&l->items;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                      __begin2);
  i = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)__begin2);
  for (; __end2 != i; __end2 = __end2 + 1) {
    local_40 = __end2;
    puVar1 = __range2->space;
    pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2);
    pEVar2 = cloneExpression(this,pEVar2);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_48,pEVar2);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)(puVar1 + 3),
               &local_48);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_48);
  }
  return (AggregateInitialiserList *)__range2;
}

Assistant:

heart::AggregateInitialiserList& cloneInitialiserList (const heart::AggregateInitialiserList& old)
    {
        auto& l = newModule.allocate<heart::AggregateInitialiserList> (old.location, old.type);

        for (auto& i : old.items)
            l.items.push_back (cloneExpression (i));

        return l;
    }